

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_ech_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl;
  ssl_ech_keys_st *psVar1;
  size_t sVar2;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  CBB retry_configs;
  CBB body;
  CBB CStack_88;
  CBB local_58;
  
  ssl = hs->ssl;
  uVar6 = ssl_protocol_version(ssl);
  bVar5 = true;
  if (((0x303 < uVar6) && (ssl->s3->ech_status != ssl_ech_accepted)) &&
     ((hs->ech_keys)._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl != (ssl_ech_keys_st *)0x0)) {
    iVar7 = CBB_add_u16(out,0xfe0d);
    if (((iVar7 != 0) && (iVar7 = CBB_add_u16_length_prefixed(out,&local_58), iVar7 != 0)) &&
       (iVar7 = CBB_add_u16_length_prefixed(&local_58,&CStack_88), iVar7 != 0)) {
      psVar1 = (hs->ech_keys)._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl;
      sVar2 = (psVar1->configs).size_;
      if (sVar2 != 0) {
        puVar3 = (psVar1->configs).data_;
        lVar8 = 0;
        do {
          puVar4 = *(undefined8 **)((long)&puVar3->_M_t + lVar8);
          cVar9 = '\x03';
          if (*(char *)(puVar4 + 0x17) == '\x01') {
            iVar7 = CBB_add_bytes(&CStack_88,(uint8_t *)*puVar4,puVar4[1]);
            cVar9 = iVar7 == 0;
          }
          if ((cVar9 != '\x03') && (cVar9 != '\0')) goto LAB_0013c7ff;
          lVar8 = lVar8 + 8;
        } while (sVar2 << 3 != lVar8);
      }
      iVar7 = CBB_flush(out);
      return iVar7 != 0;
    }
LAB_0013c7ff:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool ext_ech_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION ||
      ssl->s3->ech_status == ssl_ech_accepted ||  //
      hs->ech_keys == nullptr) {
    return true;
  }

  // Write the list of retry configs to |out|. Note |SSL_CTX_set1_ech_keys|
  // ensures |ech_keys| contains at least one retry config.
  CBB body, retry_configs;
  if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
      !CBB_add_u16_length_prefixed(out, &body) ||
      !CBB_add_u16_length_prefixed(&body, &retry_configs)) {
    return false;
  }
  for (const auto &config : hs->ech_keys->configs) {
    if (!config->is_retry_config()) {
      continue;
    }
    if (!CBB_add_bytes(&retry_configs, config->ech_config().raw.data(),
                       config->ech_config().raw.size())) {
      return false;
    }
  }
  return CBB_flush(out);
}